

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.hh
# Opt level: O0

void __thiscall QPDFSystemError::~QPDFSystemError(QPDFSystemError *this)

{
  QPDFSystemError *this_local;
  
  *(undefined ***)this = &PTR__QPDFSystemError_0058eff0;
  std::__cxx11::string::~string((string *)&this->description);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~QPDFSystemError() noexcept override = default;